

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::RoundDecimalOperator::Operation<short,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  anon_class_16_2_0b9647cc fun;
  short sVar1;
  reference count;
  Vector *in_RDX;
  byte in_SIL;
  DataChunk *in_RDI;
  short addition;
  short power_of_ten;
  undefined7 in_stack_ffffffffffffffb8;
  FunctionErrors in_stack_ffffffffffffffbf;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  short sVar2;
  
  sVar1 = UnsafeNumericCast<short,long,void>((&NumericHelper::POWERS_OF_TEN)[in_SIL]);
  sVar2 = sVar1 / 2;
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffc0,
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  DataChunk::size(in_RDI);
  fun.power_of_ten._0_4_ = in_stack_ffffffffffffffe0;
  fun.addition = (short *)&stack0xffffffffffffffe6;
  fun.power_of_ten._4_2_ = sVar2;
  fun.power_of_ten._6_2_ = sVar1;
  UnaryExecutor::
  Execute<short,short,duckdb::RoundDecimalOperator::Operation<short,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(short)_1_>
            ((Vector *)&stack0xffffffffffffffe4,in_RDX,(idx_t)count,fun,in_stack_ffffffffffffffbf);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}